

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginMenuBar(void)

{
  ImGuiWindow *this;
  float x1;
  float y1;
  float fVar1;
  float y2;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect clip_rect;
  ImRect bar_rect;
  ImGuiWindow *window;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    if ((this->Flags & 0x400U) == 0) {
      window._7_1_ = false;
    }
    else {
      if ((((this->DC).MenuBarAppending ^ 0xffU) & 1) == 0) {
        __assert_fail("!window->DC.MenuBarAppending",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x2ccd,"bool ImGui::BeginMenuBar()");
      }
      BeginGroup();
      PushID("##menubar");
      join_0x00001240_0x00001200_ = ImGuiWindow::MenuBarRect(this);
      x1 = ImFloor(clip_rect.Max.x + 0.5);
      y1 = ImFloor(clip_rect.Max.y + this->WindowBorderSize + 0.5);
      fVar1 = ImMax<float>(clip_rect.Max.x,bar_rect.Min.x - this->WindowRounding);
      fVar1 = ImFloor(fVar1 + 0.5);
      y2 = ImFloor(bar_rect.Min.y + 0.5);
      ImRect::ImRect((ImRect *)local_38,x1,y1,fVar1,y2);
      ImRect::ClipWith((ImRect *)local_38,&this->OuterRectClipped);
      PushClipRect((ImVec2 *)local_38,&clip_rect.Min,false);
      ImVec2::ImVec2(&local_40,clip_rect.Max.x + (this->DC).MenuBarOffset.x,
                     clip_rect.Max.y + (this->DC).MenuBarOffset.y);
      (this->DC).CursorPos = local_40;
      (this->DC).LayoutType = 1;
      (this->DC).NavLayerCurrent = (this->DC).NavLayerCurrent + 1;
      (this->DC).NavLayerCurrentMask = (this->DC).NavLayerCurrentMask << 1;
      (this->DC).MenuBarAppending = true;
      AlignTextToFramePadding();
      window._7_1_ = true;
    }
  }
  else {
    window._7_1_ = false;
  }
  return window._7_1_;
}

Assistant:

bool ImGui::BeginMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;
    if (!(window->Flags & ImGuiWindowFlags_MenuBar))
        return false;

    IM_ASSERT(!window->DC.MenuBarAppending);
    BeginGroup(); // Save position
    PushID("##menubar");

    // We don't clip with current window clipping rectangle as it is already set to the area below. However we clip with window full rect.
    // We remove 1 worth of rounding to Max.x to that text in long menus and small windows don't tend to display over the lower-right rounded area, which looks particularly glitchy.
    ImRect bar_rect = window->MenuBarRect();
    ImRect clip_rect(ImFloor(bar_rect.Min.x + 0.5f), ImFloor(bar_rect.Min.y + window->WindowBorderSize + 0.5f), ImFloor(ImMax(bar_rect.Min.x, bar_rect.Max.x - window->WindowRounding) + 0.5f), ImFloor(bar_rect.Max.y + 0.5f));
    clip_rect.ClipWith(window->OuterRectClipped);
    PushClipRect(clip_rect.Min, clip_rect.Max, false);

    window->DC.CursorPos = ImVec2(bar_rect.Min.x + window->DC.MenuBarOffset.x, bar_rect.Min.y + window->DC.MenuBarOffset.y);
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.NavLayerCurrent++;
    window->DC.NavLayerCurrentMask <<= 1;
    window->DC.MenuBarAppending = true;
    AlignTextToFramePadding();
    return true;
}